

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O2

string * __thiscall
lest::to_string<std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,lest *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,string *op,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  ostream *poVar1;
  ostringstream os;
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  to_string(&local_1d8,(string *)this);
  poVar1 = std::operator<<((ostream *)local_198,(string *)&local_1d8);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::operator<<(poVar1,(string *)lhs);
  poVar1 = std::operator<<(poVar1," ");
  to_string(&local_1b8,op);
  std::operator<<(poVar1,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::str();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p == &local_1d8.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,local_1d8.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_1d8.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_1d8._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         CONCAT71(local_1d8.field_2._M_allocated_capacity._1_7_,local_1d8.field_2._M_local_buf[0]);
  }
  __return_storage_ptr__->_M_string_length = local_1d8._M_string_length;
  local_1d8._M_string_length = 0;
  local_1d8.field_2._M_local_buf[0] = '\0';
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string( L const & lhs, std::string op, R const & rhs )
{
    std::ostringstream os; os << to_string( lhs ) << " " << op << " " << to_string( rhs ); return os.str();
}